

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>
 __thiscall
(anonymous_namespace)::
BuildLowbdLumaParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
          (_anonymous_namespace_ *this,
          _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
          *test_func)

{
  element_type *extraout_RAX;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>
  PVar1;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  local_30;
  
  GetLowbdLumaTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
            (&local_30,(_anonymous_namespace_ *)test_func,in_RDX);
  PVar1 = testing::
          ValuesIn<std::vector<(anonymous_namespace)::TestParam<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>,std::allocator<(anonymous_namespace)::TestParam<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>>>>
                    ((vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                      *)this);
  if (local_30.
      super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    PVar1.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    PVar1.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = extraout_RAX;
    return (ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>
            )PVar1.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  return (shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
          )(shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
            )PVar1;
}

Assistant:

::testing::internal::ParamGenerator<TestParam<T>> BuildLowbdLumaParams(
    T test_func) {
  return ::testing::ValuesIn(GetLowbdLumaTestParams(test_func));
}